

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_init_eb2.cpp
# Opt level: O1

void __thiscall NavierStokesBase::set_body_state(NavierStokesBase *this,MultiFab *S)

{
  size_t __n;
  uint uVar1;
  pointer __src;
  int iVar2;
  Arena *pAVar3;
  undefined4 extraout_var;
  double *pdVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  int n;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  AsyncArray<double,_0> body_state_lcl;
  MFIter mfi;
  AsyncArray<double,_0> local_1a8;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  int *local_178;
  long local_170;
  long local_168;
  ulong local_160;
  long local_158;
  long local_150;
  int *local_148;
  ulong local_140;
  long local_138;
  Box local_12c;
  Array4<double> local_110;
  Array4<int> local_d0;
  MFIter local_90;
  
  if (!no_eb_in_domain) {
    if (!body_state_set) {
      define_body_state(this);
    }
    __src = body_state.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
    uVar1 = (S->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
    local_1a8.d_data = (double *)0x0;
    local_1a8.h_data = (double *)0x0;
    if ((long)(int)uVar1 != 0) {
      pAVar3 = amrex::The_Pinned_Arena();
      __n = (long)(int)uVar1 * 8;
      iVar2 = (*pAVar3->_vptr_Arena[2])(pAVar3,__n);
      local_1a8.h_data = (double *)CONCAT44(extraout_var,iVar2);
      memcpy(local_1a8.h_data,__src,__n);
    }
    amrex::MFIter::MFIter(&local_90,(FabArrayBase *)S,true);
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        amrex::MFIter::tilebox(&local_12c,&local_90);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_110,&S->super_FabArray<amrex::FArrayBox>,&local_90);
        amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                  (&local_d0,&this->ebmask,&local_90);
        pdVar4 = local_1a8.d_data;
        if (local_1a8.d_data == (double *)0x0) {
          pdVar4 = local_1a8.h_data;
        }
        if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
          local_178 = local_d0.p;
          local_150 = local_d0.jstride;
          local_180 = local_d0.kstride;
          local_188 = (long)local_d0.begin.z;
          local_158 = (long)local_d0.begin.y;
          local_140 = (ulong)(uint)local_12c.bigend.vect[0];
          local_198 = (long)local_12c.smallend.vect[1];
          local_138 = local_110.jstride * 8;
          local_160 = (ulong)(uint)local_12c.bigend.vect[1];
          local_190 = (local_198 - local_110.begin.y) * local_138 +
                      (long)local_12c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8 +
                      (long)local_110.p;
          local_168 = local_110.kstride * 8;
          local_170 = -(long)local_110.begin.z;
          iVar2 = local_12c.smallend.vect[2];
          do {
            if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
              pdVar7 = (double *)((local_170 + iVar2) * local_168 + local_190);
              local_148 = local_d0.p + (iVar2 - local_188) * local_d0.kstride;
              lVar5 = local_198;
              do {
                if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                  pdVar6 = pdVar7;
                  lVar10 = (long)local_12c.smallend.vect[0];
                  do {
                    if ((0 < (int)uVar1) &&
                       (local_148[(lVar5 - local_158) * local_d0.jstride +
                                  (lVar10 - local_d0.begin.x)] == -1)) {
                      uVar9 = 0;
                      pdVar8 = pdVar6;
                      do {
                        *pdVar8 = pdVar4[uVar9];
                        uVar9 = uVar9 + 1;
                        pdVar8 = pdVar8 + local_110.nstride;
                      } while (uVar1 != uVar9);
                    }
                    lVar10 = lVar10 + 1;
                    pdVar6 = pdVar6 + 1;
                  } while (local_12c.bigend.vect[0] + 1U != (int)lVar10);
                }
                lVar5 = lVar5 + 1;
                pdVar7 = pdVar7 + local_110.jstride;
              } while (local_12c.bigend.vect[1] + 1U != (int)lVar5);
            }
            bVar11 = iVar2 != local_12c.bigend.vect[2];
            iVar2 = iVar2 + 1;
          } while (bVar11);
        }
        amrex::MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    amrex::MFIter::~MFIter(&local_90);
    amrex::Gpu::AsyncArray<double,_0>::~AsyncArray(&local_1a8);
  }
  return;
}

Assistant:

void
NavierStokesBase::set_body_state(MultiFab& S)
{
  if (no_eb_in_domain) return;

  if (!body_state_set)
  {
    define_body_state();
  }

  BL_ASSERT(S.nComp() == body_state.size());
  int nc = S.nComp();
  int covered_val = -1;

  // Need a GPU copy of body_state that's not a static attribute of the NSB class
  AsyncArray<amrex::Real> body_state_lcl(body_state.data(),nc);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
  for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
  {
    const Box& bx = mfi.tilebox();
    auto const& state = S.array(mfi);
    auto const& mask = ebmask.array(mfi);
    Real* state_lcl = body_state_lcl.data();
    amrex::ParallelFor(bx, [state,mask,nc,covered_val,state_lcl]
    AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        set_body_state_k(i,j,k,nc,state_lcl,covered_val,mask,state);
    });
  }
}